

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSplitter.h
# Opt level: O0

void __thiscall Assimp::LineSplitter::get_tokens<10ul>(LineSplitter *this,char *(*tokens) [10])

{
  bool bVar1;
  range_error *this_00;
  byte local_41;
  ulong local_28;
  size_t i;
  char *s;
  char *(*tokens_local) [10];
  LineSplitter *this_local;
  
  s = (char *)tokens;
  tokens_local = (char *(*) [10])this;
  operator->[abi_cxx11_(this);
  i = std::__cxx11::string::c_str();
  SkipSpaces<char>((char **)&i);
  local_28 = 0;
  while( true ) {
    if (9 < local_28) {
      return;
    }
    bVar1 = IsLineEnd<char>(*(char *)i);
    if (bVar1) break;
    *(size_t *)(s + local_28 * 8) = i;
    while( true ) {
      local_41 = 0;
      if (*(char *)i != '\0') {
        bVar1 = IsSpace<char>(*(char *)i);
        local_41 = bVar1 ^ 0xff;
      }
      if ((local_41 & 1) == 0) break;
      i = i + 1;
    }
    SkipSpaces<char>((char **)&i);
    local_28 = local_28 + 1;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"Token count out of range, EOL reached");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

AI_FORCE_INLINE
void LineSplitter::get_tokens(const char* (&tokens)[N]) const {
    const char* s = operator->()->c_str();

    SkipSpaces(&s);
    for (size_t i = 0; i < N; ++i) {
        if (IsLineEnd(*s)) {
            throw std::range_error("Token count out of range, EOL reached");
        }
        tokens[i] = s;

        for (; *s && !IsSpace(*s); ++s);
        SkipSpaces(&s);
    }
}